

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

ProgramSources * __thiscall
deqp::gles31::Functional::anon_unknown_1::IsolinesRenderCase::makeSources
          (ProgramSources *__return_storage_ptr__,IsolinesRenderCase *this,
          TessPrimitiveType primitiveType,SpacingMode spacing,char *vtxOutPosAttrName)

{
  Context *pCVar1;
  Context *pCVar2;
  ProgramSources *pPVar3;
  char *code;
  undefined1 usePointMode;
  string local_310;
  ShaderSource local_2f0;
  string local_2c8;
  ShaderSource local_2a8;
  string local_280;
  ShaderSource local_260;
  ProgramSources local_238;
  allocator<char> local_161;
  string local_160 [8];
  string fragmentShaderTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  string tessellationEvaluationTemplate;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string vertexShaderTemplate;
  char *vtxOutPosAttrName_local;
  SpacingMode spacing_local;
  TessPrimitiveType primitiveType_local;
  IsolinesRenderCase *this_local;
  
  usePointMode = SUB81(vtxOutPosAttrName,0);
  vertexShaderTemplate.field_2._8_8_ = vtxOutPosAttrName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,vtxOutPosAttrName,&local_c9);
  std::operator+(&local_a8,"${GLSL_VERSION_DECL}\n\nin highp vec2 in_v_position;\n\nout highp vec2 "
                 ,&local_c8);
  std::operator+(&local_88,&local_a8,";\n\nvoid main (void)\n{\n\t");
  std::operator+(&local_68,&local_88,(char *)vertexShaderTemplate.field_2._8_8_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68," = in_v_position;\n}\n");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  code = (char *)0x0;
  Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)((long)&fragmentShaderTemplate.field_2 + 8),(_anonymous_namespace_ *)0x2,
             spacing,SPACINGMODE_EQUAL,(bool)usePointMode);
  std::operator+(&local_120,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&fragmentShaderTemplate.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 &local_120,
                 "\nin highp vec2 in_te_position[];\n\nout mediump vec4 in_f_color;\n\nuniform mediump float u_tessLevelOuter0;\nuniform mediump float u_tessLevelOuter1;\n\nvoid main (void)\n{\n\thighp vec2 corner0 = in_te_position[0];\n\thighp vec2 corner1 = in_te_position[1];\n\thighp vec2 corner2 = in_te_position[2];\n\thighp vec2 corner3 = in_te_position[3];\n\thighp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner0\n\t               + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner1\n\t               + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*corner2\n\t               + (    gl_TessCoord.x)*(    gl_TessCoord.y)*corner3;\n\tpos.y += 0.15*sin(gl_TessCoord.x*10.0);\n\tgl_Position = vec4(pos, 0.0, 1.0);\n\thighp int phaseX = int(round(gl_TessCoord.x*u_tessLevelOuter1));\n\thighp int phaseY = int(round(gl_TessCoord.y*u_tessLevelOuter0));\n\thighp int phase = (phaseX + phaseY) % 3;\n\tin_f_color = phase == 0 ? vec4(1.0, 0.0, 0.0, 1.0)\n\t           : phase == 1 ? vec4(0.0, 1.0, 0.0, 1.0)\n\t           :              vec4(0.0, 0.0, 1.0, 1.0);\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)(fragmentShaderTemplate.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_160,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin mediump vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,&local_161);
  std::allocator<char>::~allocator(&local_161);
  glu::ProgramSources::ProgramSources(&local_238);
  pCVar1 = (this->super_BasicVariousTessLevelsPosAttrCase).super_TestCase.m_context;
  pCVar2 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_280,(_anonymous_namespace_ *)pCVar1,pCVar2,code);
  glu::VertexSource::VertexSource((VertexSource *)&local_260,&local_280);
  pPVar3 = glu::ProgramSources::operator<<(&local_238,&local_260);
  pCVar1 = (this->super_BasicVariousTessLevelsPosAttrCase).super_TestCase.m_context;
  pCVar2 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2c8,(_anonymous_namespace_ *)pCVar1,pCVar2,code);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_2a8,&local_2c8);
  pPVar3 = glu::ProgramSources::operator<<(pPVar3,&local_2a8);
  pCVar1 = (this->super_BasicVariousTessLevelsPosAttrCase).super_TestCase.m_context;
  pCVar2 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_310,(_anonymous_namespace_ *)pCVar1,pCVar2,code);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_2f0,&local_310);
  pPVar3 = glu::ProgramSources::operator<<(pPVar3,&local_2f0);
  glu::ProgramSources::ProgramSources(__return_storage_ptr__,pPVar3);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  glu::VertexSource::~VertexSource((VertexSource *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  glu::ProgramSources::~ProgramSources(&local_238);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

const glu::ProgramSources makeSources (TessPrimitiveType primitiveType, SpacingMode spacing, const char* vtxOutPosAttrName) const
	{
		DE_ASSERT(primitiveType == TESSPRIMITIVETYPE_ISOLINES);
		DE_UNREF(primitiveType);

		std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "in highp vec2 in_v_position;\n"
													 "\n"
													 "out highp vec2 " + string(vtxOutPosAttrName) + ";\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	" + vtxOutPosAttrName + " = in_v_position;\n"
													 "}\n");
		std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
													 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 + getTessellationEvaluationInLayoutString(TESSPRIMITIVETYPE_ISOLINES, spacing) +
													 "\n"
													 "in highp vec2 in_te_position[];\n"
													 "\n"
													 "out mediump vec4 in_f_color;\n"
													 "\n"
													 "uniform mediump float u_tessLevelOuter0;\n"
													 "uniform mediump float u_tessLevelOuter1;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	highp vec2 corner0 = in_te_position[0];\n"
													 "	highp vec2 corner1 = in_te_position[1];\n"
													 "	highp vec2 corner2 = in_te_position[2];\n"
													 "	highp vec2 corner3 = in_te_position[3];\n"
													 "	highp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner0\n"
													 "	               + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner1\n"
													 "	               + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*corner2\n"
													 "	               + (    gl_TessCoord.x)*(    gl_TessCoord.y)*corner3;\n"
													 "	pos.y += 0.15*sin(gl_TessCoord.x*10.0);\n"
													 "	gl_Position = vec4(pos, 0.0, 1.0);\n"
													 "	highp int phaseX = int(round(gl_TessCoord.x*u_tessLevelOuter1));\n"
													 "	highp int phaseY = int(round(gl_TessCoord.y*u_tessLevelOuter0));\n"
													 "	highp int phase = (phaseX + phaseY) % 3;\n"
													 "	in_f_color = phase == 0 ? vec4(1.0, 0.0, 0.0, 1.0)\n"
													 "	           : phase == 1 ? vec4(0.0, 1.0, 0.0, 1.0)\n"
													 "	           :              vec4(0.0, 0.0, 1.0, 1.0);\n"
													 "}\n");
		std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "in mediump vec4 in_f_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = in_f_color;\n"
													 "}\n");

		return glu::ProgramSources()
				<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
				<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
				<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()));
	}